

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O3

void __thiscall
RenX_RelayPlugin::upstream_disconnected
          (RenX_RelayPlugin *this,Server *param_1,upstream_server_info *in_server_info)

{
  _Elt_pointer ppuVar1;
  TCPSocket *pTVar2;
  upstream_server_info **server_ptr;
  _Elt_pointer ppuVar3;
  _Elt_pointer ppuVar4;
  
  in_server_info->m_connected = false;
  ppuVar3 = (this->m_command_tracker).
            super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar1 = (this->m_command_tracker).
            super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppuVar3 != ppuVar1) {
    ppuVar4 = (this->m_command_tracker).
              super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    param_1 = (Server *)
              (this->m_command_tracker).
              super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (*ppuVar3 == in_server_info) {
        *ppuVar3 = (upstream_server_info *)0x0;
      }
      ppuVar3 = ppuVar3 + 1;
      if (ppuVar3 == ppuVar4) {
        ppuVar3 = *(_Elt_pointer *)(param_1 + 8);
        param_1 = param_1 + 8;
        ppuVar4 = ppuVar3 + 0x40;
      }
    } while (ppuVar3 != ppuVar1);
  }
  pTVar2 = (in_server_info->m_socket)._M_t.
           super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>._M_t.
           super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>.
           super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl;
  if (pTVar2 != (TCPSocket *)0x0) {
    (**(code **)(*(long *)pTVar2 + 0x28))(pTVar2,param_1);
    return;
  }
  return;
}

Assistant:

void RenX_RelayPlugin::upstream_disconnected(RenX::Server&, upstream_server_info& in_server_info) {
	in_server_info.m_connected = false;

	// Clear references to `in_server_info`
	for (auto& server_ptr : m_command_tracker) {
		if (server_ptr == &in_server_info) {
			server_ptr = nullptr;
		}
	}

	if (in_server_info.m_socket) {
		in_server_info.m_socket->close();
	}
}